

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  ulong *puVar1;
  uint uVar2;
  LZ4_stream_t_internal *__src;
  int iVar3;
  char cVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char cVar11;
  ulong uVar12;
  ulong *puVar13;
  long lVar14;
  ulong *puVar15;
  ulong *puVar16;
  long *plVar17;
  uint uVar18;
  int iVar19;
  int *piVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  BYTE *e;
  int *piVar24;
  long *plVar25;
  BYTE *e_3;
  uint uVar26;
  ulong *puVar27;
  long lVar28;
  long lVar29;
  ulong *puVar30;
  ulong *puVar31;
  long *plVar32;
  char *pcVar33;
  int *piVar34;
  uint uVar35;
  int *piVar36;
  BYTE *e_4;
  long lVar37;
  BYTE *s;
  long *plVar38;
  uint uVar39;
  BYTE *e_1;
  BYTE *s_2;
  long lVar40;
  ulong *puVar41;
  ulong *puVar42;
  ulong *puVar43;
  int iVar44;
  BYTE *e_2;
  char *local_100;
  char *local_f8;
  U32 *hashTable_16;
  int local_d8;
  int local_c8;
  U32 *hashTable;
  uint local_58;
  
  if ((ulong)(LZ4_stream->internal_donotuse).dictSize == 0) {
    piVar24 = (int *)0x0;
  }
  else {
    piVar24 = (int *)((LZ4_stream->internal_donotuse).dictionary +
                     (LZ4_stream->internal_donotuse).dictSize);
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  uVar9 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (((((LZ4_stream->internal_donotuse).dictSize < 4) && (0 < inputSize)) &&
      (piVar24 != (int *)source)) &&
     ((LZ4_stream->internal_donotuse).dictCtx == (LZ4_stream_t_internal *)0x0)) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    uVar9 = 0;
    piVar24 = (int *)source;
  }
  piVar20 = (int *)(source + inputSize);
  piVar34 = (int *)(LZ4_stream->internal_donotuse).dictionary;
  if ((piVar34 < piVar20) && (piVar20 < piVar24)) {
    uVar26 = (int)piVar24 - (int)piVar20;
    uVar39 = 0x10000;
    if (uVar26 < 0x10000) {
      uVar39 = uVar26;
    }
    uVar9 = 0;
    if (3 < uVar26) {
      uVar9 = (ulong)uVar39;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar9;
    piVar34 = (int *)((long)piVar24 - uVar9);
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)piVar34;
  }
  uVar39 = (uint)uVar9;
  local_c8 = (int)dest;
  if (piVar24 != (int *)source) {
    __src = (LZ4_stream->internal_donotuse).dictCtx;
    if (__src == (LZ4_stream_t_internal *)0x0) {
      puVar41 = (ulong *)source;
      if (uVar39 < 0x10000) {
        uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
        if (uVar26 <= uVar39) goto LAB_00116958;
        uVar23 = 0;
        if (0x7e000000 < (uint)inputSize) goto LAB_00118565;
        if (inputSize == 0) goto LAB_0011710b;
        lVar37 = uVar9 + (long)piVar34;
        lVar40 = lVar37 - (ulong)uVar26;
        if (piVar34 == (int *)0x0) {
          lVar40 = 0;
        }
        pcVar10 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar39 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = inputSize + uVar26;
        (LZ4_stream->internal_donotuse).tableType = 2;
        local_100 = dest;
        if (0xc < (uint)inputSize) {
          lVar5 = (long)source - (ulong)uVar26;
          puVar42 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
          puVar30 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar34 == (int *)0x0) {
            lVar37 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar26;
          puVar43 = (ulong *)(source + 2);
          puVar31 = (ulong *)(source + 1);
          uVar23 = uVar26 + 1;
          puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00116199:
          uVar9 = *(ulong *)((long)puVar41 + 1);
          uVar35 = acceleration;
          uVar18 = acceleration * 0x40;
          do {
            uVar18 = uVar18 + 1;
            uVar12 = uVar9 * -0x30e4432345000000 >> 0x34;
            uVar2 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            uVar9 = *puVar43;
            *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar23;
            local_d8 = (int)lVar5;
            if ((uVar26 - uVar39 <= uVar2) && (uVar23 <= uVar2 + 0xffff)) {
              lVar14 = lVar40;
              if (uVar26 <= uVar2) {
                lVar14 = lVar5;
              }
              if (*(int *)(lVar14 + (ulong)uVar2) == (int)*puVar31) goto LAB_00116210;
            }
            uVar23 = (int)puVar43 - local_d8;
            puVar13 = (ulong *)((ulong)uVar35 + (long)puVar43);
            uVar35 = uVar18 >> 6;
            puVar31 = puVar43;
            puVar43 = puVar13;
            if (puVar42 < puVar13) break;
          } while( true );
        }
LAB_001183c9:
        pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar41);
        uVar23 = 0;
        if (pcVar10 < local_100 + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1))
        goto LAB_00118565;
        if (pcVar8 < (char *)0xf) {
          *local_100 = (char)pcVar8 << 4;
        }
        else {
          pcVar10 = pcVar8 + -0xf;
          *local_100 = -0x10;
          pcVar33 = local_100 + 1;
          if ((char *)0xfe < pcVar10) {
            uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
            memset(pcVar33,0xff,uVar9 + 1);
            pcVar10 = pcVar8 + uVar9 * -0xff + -0x10e;
            pcVar33 = local_100 + uVar9 + 2;
          }
          *pcVar33 = (char)pcVar10;
          local_100 = pcVar33;
        }
      }
      else {
LAB_00116958:
        uVar23 = 0;
        if (0x7e000000 < (uint)inputSize) goto LAB_00118565;
        if (inputSize == 0) goto LAB_0011710b;
        uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar37 = uVar9 + (long)piVar34;
        lVar40 = lVar37 - (ulong)uVar26;
        if (piVar34 == (int *)0x0) {
          lVar40 = 0;
        }
        pcVar10 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar39 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = inputSize + uVar26;
        (LZ4_stream->internal_donotuse).tableType = 2;
        local_f8 = dest;
        if (0xc < (uint)inputSize) {
          lVar5 = (long)source - (ulong)uVar26;
          puVar42 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
          puVar30 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar34 == (int *)0x0) {
            lVar37 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar26;
          puVar43 = (ulong *)(source + 2);
          puVar31 = (ulong *)(source + 1);
          uVar39 = uVar26 + 1;
          puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00116a81:
          uVar9 = *(ulong *)((long)puVar41 + 1);
          uVar18 = acceleration;
          uVar23 = acceleration * 0x40;
          do {
            uVar23 = uVar23 + 1;
            uVar12 = uVar9 * -0x30e4432345000000 >> 0x34;
            uVar35 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            uVar9 = *puVar43;
            *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar39;
            local_d8 = (int)lVar5;
            if (uVar39 <= uVar35 + 0xffff) {
              lVar14 = lVar40;
              if (uVar26 <= uVar35) {
                lVar14 = lVar5;
              }
              if (*(int *)(lVar14 + (ulong)uVar35) == (int)*puVar31) goto LAB_00116aee;
            }
            uVar39 = (int)puVar43 - local_d8;
            puVar13 = (ulong *)((ulong)uVar18 + (long)puVar43);
            uVar18 = uVar23 >> 6;
            puVar31 = puVar43;
            puVar43 = puVar13;
            if (puVar42 < puVar13) break;
          } while( true );
        }
LAB_00117dc4:
        pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar41);
        uVar23 = 0;
        if (pcVar10 < local_f8 + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1))
        goto LAB_00118565;
        if (pcVar8 < (char *)0xf) {
          *local_f8 = (char)pcVar8 << 4;
          local_100 = local_f8;
        }
        else {
          pcVar10 = pcVar8 + -0xf;
          *local_f8 = -0x10;
          local_100 = local_f8 + 1;
          if ((char *)0xfe < pcVar10) {
            uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
            memset(local_100,0xff,uVar9 + 1);
            pcVar10 = pcVar8 + uVar9 * -0xff + -0x10e;
            local_100 = local_f8 + uVar9 + 2;
          }
          *local_100 = (char)pcVar10;
        }
      }
      memcpy(local_100 + 1,puVar41,(size_t)pcVar8);
      uVar23 = ((int)(local_100 + 1) + (int)pcVar8) - local_c8;
    }
    else {
      puVar41 = (ulong *)source;
      if (0x1000 < inputSize) {
        memcpy(LZ4_stream,__src,0x4020);
        uVar23 = 0;
        if ((uint)inputSize < 0x7e000001) {
          uVar39 = (LZ4_stream->internal_donotuse).currentOffset;
          lVar5 = (long)source - (ulong)uVar39;
          piVar24 = (int *)(LZ4_stream->internal_donotuse).dictionary;
          lVar37 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar24;
          lVar40 = lVar37 - (ulong)uVar39;
          pcVar10 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize =
               (LZ4_stream->internal_donotuse).dictSize + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = inputSize + uVar39;
          (LZ4_stream->internal_donotuse).tableType = 2;
          puVar42 = (ulong *)(source + 2);
          puVar30 = (ulong *)(source + 1);
          uVar26 = uVar39 + 1;
          puVar43 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
          puVar31 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar24 == (int *)0x0) {
            lVar40 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar39;
          if (piVar24 == (int *)0x0) {
            lVar37 = 0;
          }
          puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00115909:
          uVar9 = *(ulong *)((long)puVar41 + 1);
          uVar18 = acceleration;
          uVar23 = acceleration * 0x40;
          do {
            uVar23 = uVar23 + 1;
            uVar12 = uVar9 * -0x30e4432345000000 >> 0x34;
            uVar35 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            uVar9 = *puVar42;
            *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar26;
            iVar19 = (int)lVar5;
            if (uVar26 <= uVar35 + 0xffff) {
              lVar14 = lVar40;
              if (uVar39 <= uVar35) {
                lVar14 = lVar5;
              }
              if (*(int *)(lVar14 + (ulong)uVar35) == (int)*puVar30) goto LAB_00115973;
            }
            uVar26 = (int)puVar42 - iVar19;
            puVar13 = (ulong *)((ulong)uVar18 + (long)puVar42);
            uVar18 = uVar23 >> 6;
            puVar30 = puVar42;
            puVar42 = puVar13;
            if (puVar43 < puVar13) goto LAB_0011846d;
          } while( true );
        }
        goto LAB_00118565;
      }
      uVar23 = 0;
      if (0x7e000000 < (uint)inputSize) goto LAB_00118565;
      if (inputSize != 0) {
        uVar39 = (LZ4_stream->internal_donotuse).currentOffset;
        piVar24 = (int *)__src->dictionary;
        uVar26 = __src->currentOffset;
        lVar37 = (ulong)__src->dictSize + (long)piVar24;
        lVar40 = lVar37 - (ulong)uVar26;
        if (piVar24 == (int *)0x0) {
          lVar40 = 0;
        }
        (LZ4_stream->internal_donotuse).dictCtx = (LZ4_stream_t_internal *)0x0;
        pcVar10 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar39 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < (uint)inputSize) {
          lVar5 = (long)source - (ulong)uVar39;
          iVar19 = uVar39 - uVar26;
          puVar42 = (ulong *)(source + ((ulong)(uint)inputSize - 0xb));
          puVar30 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
          if (piVar24 == (int *)0x0) {
            lVar37 = 0;
          }
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar39;
          puVar43 = (ulong *)(source + 2);
          puVar31 = (ulong *)(source + 1);
          uVar26 = uVar39 + 1;
          puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_001176ab:
          uVar9 = *(ulong *)((long)puVar41 + 1);
          uVar18 = acceleration;
          uVar23 = acceleration * 0x40;
          while( true ) {
            uVar23 = uVar23 + 1;
            uVar12 = uVar9 * -0x30e4432345000000 >> 0x34;
            uVar35 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            if (uVar35 < uVar39) {
              uVar35 = __src->hashTable[uVar12] + iVar19;
              piVar34 = (int *)((ulong)__src->hashTable[uVar12] + lVar40);
              piVar20 = piVar24;
            }
            else {
              piVar34 = (int *)(lVar5 + (ulong)uVar35);
              piVar20 = (int *)source;
            }
            uVar9 = *puVar43;
            *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar26;
            iVar22 = (int)lVar5;
            if ((uVar26 <= uVar35 + 0xffff) && (*piVar34 == (int)*puVar31)) break;
            uVar26 = (int)puVar43 - iVar22;
            puVar13 = (ulong *)((ulong)uVar18 + (long)puVar43);
            uVar18 = uVar23 >> 6;
            puVar31 = puVar43;
            puVar43 = puVar13;
            if (puVar42 < puVar13) goto LAB_001168c1;
          }
          iVar44 = uVar26 - uVar35;
          uVar18 = (int)puVar31 - (int)puVar41;
          lVar14 = 0;
          uVar26 = uVar18 - 0xf;
          cVar4 = (char)puVar31 * '\x10' + (char)puVar41 * -0x10;
          do {
            cVar11 = cVar4;
            uVar35 = uVar26;
            lVar29 = lVar14;
            piVar36 = (int *)((long)piVar34 + lVar29);
            puVar43 = (ulong *)((long)puVar31 + lVar29);
            if ((piVar36 <= piVar20) || (puVar43 <= puVar41)) break;
            lVar14 = lVar29 + -1;
            uVar26 = uVar35 - 1;
            cVar4 = cVar11 + -0x10;
          } while (*(char *)((long)puVar31 + lVar29 + -1) == *(char *)((long)piVar34 + lVar29 + -1))
          ;
          iVar3 = (int)lVar29;
          uVar9 = (ulong)(uint)(((int)puVar31 - (int)puVar41) + iVar3);
          uVar23 = 0;
          if (dest + ((ulong)uVar18 + lVar29 & 0xffffffff) / 0xff + uVar9 + 9 <= pcVar10) {
            puVar31 = (ulong *)(dest + 1);
            local_58 = (uint)((ulong)uVar18 + lVar29);
            if (local_58 < 0xf) {
              *dest = cVar11;
            }
            else {
              uVar12 = (ulong)(uVar18 - 0xf) + lVar29;
              *dest = -0x10;
              if (0xfe < (int)uVar12) {
                uVar26 = 0x1fd;
                if (uVar35 < 0x1fd) {
                  uVar26 = uVar35;
                }
                if (0x1fc < (int)uVar35) {
                  uVar35 = 0x1fd;
                }
                memset(puVar31,0xff,(ulong)((((uVar18 + 0xef) - uVar26) + iVar3) / 0xff + 1));
                uVar26 = ((uVar18 + 0xef) - uVar35) + iVar3;
                puVar31 = (ulong *)(dest + (ulong)uVar26 / 0xff + 2);
                uVar12 = (ulong)((uVar18 - 0x10e) + iVar3 + (uVar26 % 0xff - uVar26));
              }
              *(char *)puVar31 = (char)uVar12;
              puVar31 = (ulong *)((long)puVar31 + 1);
            }
            puVar13 = (ulong *)(uVar9 + (long)puVar31);
            do {
              *puVar31 = *puVar41;
              puVar31 = puVar31 + 1;
              puVar41 = puVar41 + 1;
            } while (puVar31 < puVar13);
            do {
              *(short *)puVar13 = (short)iVar44;
              if (piVar20 == piVar24) {
                puVar31 = (ulong *)((lVar37 - (long)piVar36) + (long)puVar43);
                if (puVar30 < puVar31) {
                  puVar31 = puVar30;
                }
                puVar41 = (ulong *)((long)puVar43 + 4);
                puVar27 = (ulong *)(piVar36 + 1);
                puVar15 = (ulong *)((long)puVar31 - 7);
                puVar16 = puVar41;
                if (puVar41 < puVar15) {
                  if (*puVar27 == *puVar41) {
                    puVar27 = (ulong *)(piVar36 + 3);
                    puVar16 = (ulong *)((long)puVar43 + 0xc);
                    goto LAB_00117a00;
                  }
                  uVar9 = *puVar41 ^ *puVar27;
                  lVar14 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                    }
                  }
                  uVar26 = (uint)lVar14 >> 3;
                }
                else {
LAB_00117a00:
                  if (puVar16 < puVar15) {
                    iVar44 = ((int)puVar16 - (int)puVar43) + -4;
LAB_00117a12:
                    if (*puVar27 == *puVar16) goto code_r0x00117a1d;
                    uVar12 = *puVar16 ^ *puVar27;
                    uVar9 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    uVar26 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar44;
                    goto LAB_00117aa4;
                  }
LAB_00117a2e:
                  if ((puVar16 < (ulong *)((long)puVar31 - 3U)) && ((int)*puVar27 == (int)*puVar16))
                  {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar27 = (ulong *)((long)puVar27 + 4);
                  }
                  if ((puVar16 < (ulong *)((long)puVar31 - 1U)) &&
                     ((short)*puVar27 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar27 = (ulong *)((long)puVar27 + 2);
                  }
                  if (puVar16 < puVar31) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar27 == (char)*puVar16));
                  }
                  uVar26 = (int)puVar16 - (int)puVar41;
                }
LAB_00117aa4:
                puVar41 = (ulong *)((long)puVar43 + (ulong)uVar26 + 4);
                if (puVar41 == puVar31) {
                  puVar15 = puVar31;
                  puVar27 = (ulong *)source;
                  if (puVar31 < puVar1) {
                    if (*(ulong *)source == *puVar31) {
                      puVar15 = puVar31 + 1;
                      puVar27 = (ulong *)(source + 8);
                      goto LAB_00117adc;
                    }
                    uVar12 = *puVar31 ^ *(ulong *)source;
                    uVar9 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    uVar9 = uVar9 >> 3 & 0x1fffffff;
                  }
                  else {
LAB_00117adc:
                    if (puVar15 < puVar1) {
                      puVar43 = (ulong *)((long)puVar43 + (lVar37 - (long)piVar36));
                      if (puVar30 <= puVar43) {
                        puVar43 = puVar30;
                      }
                      iVar44 = (int)puVar15 - (int)puVar43;
LAB_00117afe:
                      if (*puVar27 == *puVar15) goto code_r0x00117b09;
                      uVar12 = *puVar15 ^ *puVar27;
                      uVar9 = 0;
                      if (uVar12 != 0) {
                        for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                        }
                      }
                      uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar44);
                      goto LAB_00117b8a;
                    }
LAB_00117b1a:
                    if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                       ((int)*puVar27 == (int)*puVar15)) {
                      puVar15 = (ulong *)((long)puVar15 + 4);
                      puVar27 = (ulong *)((long)puVar27 + 4);
                    }
                    if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                       ((short)*puVar27 == (short)*puVar15)) {
                      puVar15 = (ulong *)((long)puVar15 + 2);
                      puVar27 = (ulong *)((long)puVar27 + 2);
                    }
                    if (puVar15 < puVar30) {
                      puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar27 == (char)*puVar15))
                      ;
                    }
                    uVar9 = (ulong)(uint)((int)puVar15 - (int)puVar31);
                  }
LAB_00117b8a:
                  uVar26 = uVar26 + (int)uVar9;
                  puVar41 = (ulong *)((long)puVar41 + uVar9);
                }
              }
              else {
                puVar41 = (ulong *)((long)puVar43 + 4);
                puVar31 = (ulong *)(piVar36 + 1);
                puVar15 = puVar41;
                if (puVar41 < puVar1) {
                  if (*puVar31 == *puVar41) {
                    puVar31 = (ulong *)(piVar36 + 3);
                    puVar15 = (ulong *)((long)puVar43 + 0xc);
                    goto LAB_0011793e;
                  }
                  uVar9 = *puVar41 ^ *puVar31;
                  lVar14 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                    }
                  }
                  uVar26 = (uint)lVar14 >> 3;
                }
                else {
LAB_0011793e:
                  if (puVar15 < puVar1) {
                    iVar44 = ((int)puVar15 - (int)puVar43) + -4;
LAB_0011794b:
                    if (*puVar31 == *puVar15) goto code_r0x0011795a;
                    uVar12 = *puVar15 ^ *puVar31;
                    uVar9 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    uVar26 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar44;
                    goto LAB_00117a70;
                  }
LAB_0011796a:
                  if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar31 == (int)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar31 == (short)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar15 < puVar30) {
                    puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar31 == (char)*puVar15));
                  }
                  uVar26 = (int)puVar15 - (int)puVar41;
                }
LAB_00117a70:
                puVar41 = (ulong *)((long)puVar43 + (ulong)uVar26 + 4);
              }
              uVar23 = 0;
              if (pcVar10 < (char *)((long)puVar13 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) break;
              pcVar8 = (char *)((long)puVar13 + 2);
              if (uVar26 < 0xf) {
                *dest = *dest + (char)uVar26;
                dest = pcVar8;
              }
              else {
                *dest = *dest + '\x0f';
                uVar21 = (ushort)(uVar26 - 0xf);
                pcVar8[0] = -1;
                pcVar8[1] = -1;
                pcVar8[2] = -1;
                pcVar8[3] = -1;
                if (0x3fb < uVar26 - 0xf) {
                  uVar21 = (ushort)((ulong)(uVar26 - 0x40b) % 0x3fc);
                  uVar9 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
                  memset((char *)((long)puVar13 + 6),0xff,uVar9 + 4);
                  pcVar8 = (char *)((long)puVar13 + uVar9 + 6);
                }
                pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
                dest = pcVar8 + uVar21 / 0xff + 1;
              }
              if (puVar42 <= puVar41) goto LAB_001168c1;
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)puVar41 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)puVar41 + -2) - iVar22;
              uVar9 = *puVar41 * -0x30e4432345000000 >> 0x34;
              uVar26 = *(uint *)((long)LZ4_stream + uVar9 * 4);
              if (uVar26 < uVar39) {
                uVar26 = iVar19 + __src->hashTable[uVar9];
                piVar36 = (int *)((ulong)__src->hashTable[uVar9] + lVar40);
                piVar20 = piVar24;
              }
              else {
                piVar36 = (int *)(lVar5 + (ulong)uVar26);
                piVar20 = (int *)source;
              }
              uVar23 = (int)puVar41 - iVar22;
              *(uint *)((long)LZ4_stream + uVar9 * 4) = uVar23;
              if ((uVar26 + 0xffff < uVar23) || (*piVar36 != (int)*puVar41)) goto LAB_00117d94;
              puVar13 = (ulong *)(dest + 1);
              *dest = '\0';
              iVar44 = uVar23 - uVar26;
              puVar43 = puVar41;
            } while( true );
          }
          goto LAB_00118565;
        }
LAB_001168c1:
        pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar41);
        uVar23 = 0;
        if (pcVar10 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) goto LAB_00118565;
        if (pcVar8 < (char *)0xf) {
          *dest = (char)pcVar8 << 4;
        }
        else {
          pcVar10 = pcVar8 + -0xf;
          *dest = -0x10;
          pcVar33 = dest + 1;
          if ((char *)0xfe < pcVar10) {
            uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
            memset(pcVar33,0xff,uVar9 + 1);
            pcVar10 = pcVar8 + uVar9 * -0xff + -0x10e;
            pcVar33 = dest + uVar9 + 2;
          }
          *pcVar33 = (char)pcVar10;
          dest = pcVar33;
        }
        goto LAB_00118518;
      }
LAB_0011710b:
      uVar23 = 0;
      if (0 < maxOutputSize) {
        *dest = '\0';
        uVar23 = 1;
      }
    }
LAB_00118565:
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    (LZ4_stream->internal_donotuse).dictSize = inputSize;
    return uVar23;
  }
  plVar38 = (long *)source;
  if (uVar39 < 0x10000) {
    uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
    if (uVar26 <= uVar39) goto LAB_00115fe8;
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize == 0) goto LAB_00117122;
    pcVar10 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = uVar39 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar26 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < (uint)inputSize) {
      lVar40 = (long)source - (ulong)uVar26;
      plVar6 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar26;
      plVar17 = (long *)(source + 2);
      puVar41 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_00117f0c:
      lVar37 = *(long *)((long)plVar38 + 1);
      plVar32 = (long *)((long)plVar38 + 1);
      uVar23 = acceleration;
      uVar18 = acceleration * 0x40;
      while( true ) {
        plVar25 = plVar17;
        uVar18 = uVar18 + 1;
        uVar12 = (ulong)(lVar37 * -0x30e4432345000000) >> 0x34;
        uVar35 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        iVar19 = (int)plVar32;
        iVar22 = (int)lVar40;
        lVar37 = *plVar25;
        *(int *)((long)LZ4_stream + uVar12 * 4) = iVar19 - iVar22;
        if (((uVar26 - uVar39 <= uVar35) && ((uint)(iVar19 - iVar22) <= uVar35 + 0xffff)) &&
           (*(int *)(lVar40 + (ulong)uVar35) == (int)*plVar32)) break;
        uVar12 = (ulong)uVar23;
        uVar23 = uVar18 >> 6;
        plVar17 = (long *)(uVar12 + (long)plVar25);
        plVar32 = plVar25;
        if (plVar6 < (long *)(uVar12 + (long)plVar25)) goto LAB_0011830e;
      }
      lVar5 = (ulong)uVar35 + lVar40;
      uVar18 = iVar19 - (int)plVar38;
      lVar37 = 0;
      uVar23 = uVar18 - 0xf;
      cVar4 = (char)plVar32 * '\x10' + (char)plVar38 * -0x10;
      do {
        cVar11 = cVar4;
        uVar35 = uVar23;
        lVar14 = lVar37;
        piVar24 = (int *)(lVar5 + lVar14);
        plVar17 = (long *)((long)plVar32 + lVar14);
        if ((piVar24 <= source + -uVar9) || (plVar17 <= plVar38)) break;
        lVar37 = lVar14 + -1;
        uVar23 = uVar35 - 1;
        cVar4 = cVar11 + -0x10;
      } while (*(char *)((long)plVar32 + lVar14 + -1) == *(char *)(lVar5 + -1 + lVar14));
      iVar44 = (int)lVar14;
      uVar12 = (ulong)(uint)(iVar44 + (iVar19 - (int)plVar38));
      if (pcVar10 < dest + ((ulong)uVar18 + lVar14 & 0xffffffff) / 0xff + uVar12 + 9) {
        return 0;
      }
      plVar32 = (long *)(dest + 1);
      if ((uint)((ulong)uVar18 + lVar14) < 0xf) {
        *dest = cVar11;
      }
      else {
        uVar7 = (ulong)(uVar18 - 0xf) + lVar14;
        *dest = -0x10;
        if (0xfe < (int)uVar7) {
          uVar23 = 0x1fd;
          if (uVar35 < 0x1fd) {
            uVar23 = uVar35;
          }
          if (0x1fc < (int)uVar35) {
            uVar35 = 0x1fd;
          }
          memset(plVar32,0xff,(ulong)((((uVar18 + 0xef) - uVar23) + iVar44) / 0xff + 1));
          uVar23 = ((uVar18 + 0xef) - uVar35) + iVar44;
          plVar32 = (long *)(dest + (ulong)uVar23 / 0xff + 2);
          uVar7 = (ulong)((uVar18 - 0x10e) + iVar44 + (uVar23 % 0xff - uVar23));
        }
        *(char *)plVar32 = (char)uVar7;
        plVar32 = (long *)((long)plVar32 + 1);
      }
      plVar25 = (long *)(uVar12 + (long)plVar32);
      do {
        *plVar32 = *plVar38;
        plVar32 = plVar32 + 1;
        plVar38 = plVar38 + 1;
      } while (plVar32 < plVar25);
      do {
        *(short *)plVar25 = (short)plVar17 - (short)piVar24;
        puVar42 = (ulong *)((long)plVar17 + 4);
        puVar30 = (ulong *)(piVar24 + 1);
        puVar43 = puVar42;
        if (puVar42 < puVar41) {
          if (*puVar30 == *puVar42) {
            puVar30 = (ulong *)(piVar24 + 3);
            puVar43 = (ulong *)((long)plVar17 + 0xc);
            goto LAB_00118109;
          }
          uVar12 = *puVar42 ^ *puVar30;
          lVar37 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar23 = (uint)lVar37 >> 3;
        }
        else {
LAB_00118109:
          if (puVar43 < puVar41) {
            iVar19 = ((int)puVar43 - (int)plVar17) + -4;
LAB_00118117:
            if (*puVar30 == *puVar43) goto code_r0x00118122;
            uVar7 = *puVar43 ^ *puVar30;
            uVar12 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar23 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00118195;
          }
LAB_00118132:
          if ((puVar43 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar30 == (int)*puVar43))
          {
            puVar43 = (ulong *)((long)puVar43 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar43 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar30 == (short)*puVar43)) {
            puVar43 = (ulong *)((long)puVar43 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar43 < source + ((ulong)(uint)inputSize - 5)) {
            puVar43 = (ulong *)((long)puVar43 + (ulong)((char)*puVar30 == (char)*puVar43));
          }
          uVar23 = (int)puVar43 - (int)puVar42;
        }
LAB_00118195:
        if (pcVar10 < (char *)((long)plVar25 + (ulong)(uVar23 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar8 = (char *)((long)plVar25 + 2);
        if (uVar23 < 0xf) {
          *dest = *dest + (char)uVar23;
          dest = pcVar8;
        }
        else {
          *dest = *dest + '\x0f';
          uVar21 = (ushort)(uVar23 - 0xf);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          if (0x3fb < uVar23 - 0xf) {
            uVar21 = (ushort)((ulong)(uVar23 - 0x40b) % 0x3fc);
            uVar12 = (ulong)((uVar23 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar25 + 6),0xff,uVar12 + 4);
            pcVar8 = (char *)((long)plVar25 + uVar12 + 6);
          }
          pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
          dest = pcVar8 + uVar21 / 0xff + 1;
        }
        lVar37 = (long)plVar17 + (ulong)uVar23;
        plVar38 = (long *)(lVar37 + 4);
        if (plVar6 <= plVar38) break;
        *(int *)((long)LZ4_stream +
                ((ulong)(*(long *)(lVar37 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar37 + 2) - iVar22;
        uVar12 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
        uVar18 = (int)plVar38 - iVar22;
        uVar23 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar18;
        if (((uVar23 < uVar26 - uVar39) || (uVar23 + 0xffff < uVar18)) ||
           (piVar24 = (int *)((ulong)uVar23 + lVar40), *piVar24 != *(int *)plVar38))
        goto LAB_001182c0;
        plVar25 = (long *)(dest + 1);
        *dest = '\0';
        plVar17 = plVar38;
      } while( true );
    }
LAB_0011830e:
    pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar38);
    if (pcVar10 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) {
      return 0;
    }
    if (pcVar8 < (char *)0xf) {
      *dest = (char)pcVar8 << 4;
      goto LAB_001183a5;
    }
    *dest = -0x10;
    pcVar10 = dest;
  }
  else {
LAB_00115fe8:
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize == 0) {
LAB_00117122:
      if (0 < maxOutputSize) {
        *dest = '\0';
      }
      return (uint)(0 < maxOutputSize);
    }
    uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
    pcVar10 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = uVar39 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar26 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < (uint)inputSize) {
      lVar40 = (long)source - (ulong)uVar26;
      plVar6 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar26;
      plVar17 = (long *)(source + 2);
      puVar41 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_001171bd:
      lVar37 = *(long *)((long)plVar38 + 1);
      plVar32 = (long *)((long)plVar38 + 1);
      uVar26 = acceleration;
      uVar39 = acceleration * 0x40;
      while( true ) {
        uVar39 = uVar39 + 1;
        uVar12 = (ulong)(lVar37 * -0x30e4432345000000) >> 0x34;
        uVar23 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        iVar19 = (int)plVar32;
        iVar22 = (int)lVar40;
        lVar37 = *plVar17;
        *(int *)((long)LZ4_stream + uVar12 * 4) = iVar19 - iVar22;
        if (((uint)(iVar19 - iVar22) <= uVar23 + 0xffff) &&
           (*(int *)(lVar40 + (ulong)uVar23) == (int)*plVar32)) break;
        plVar25 = (long *)((ulong)uVar26 + (long)plVar17);
        uVar26 = uVar39 >> 6;
        plVar32 = plVar17;
        plVar17 = plVar25;
        if (plVar6 < plVar25) goto LAB_0011759a;
      }
      lVar5 = (ulong)uVar23 + lVar40;
      uVar26 = iVar19 - (int)plVar38;
      lVar37 = 0;
      uVar39 = uVar26 - 0xf;
      cVar4 = (char)plVar32 * '\x10' + (char)plVar38 * -0x10;
      do {
        cVar11 = cVar4;
        uVar23 = uVar39;
        lVar14 = lVar37;
        piVar24 = (int *)(lVar5 + lVar14);
        plVar17 = (long *)((long)plVar32 + lVar14);
        if ((piVar24 <= source + -uVar9) || (plVar17 <= plVar38)) break;
        lVar37 = lVar14 + -1;
        uVar39 = uVar23 - 1;
        cVar4 = cVar11 + -0x10;
      } while (*(char *)((long)plVar32 + lVar14 + -1) == *(char *)(lVar5 + -1 + lVar14));
      iVar44 = (int)lVar14;
      uVar12 = (ulong)(uint)(iVar44 + (iVar19 - (int)plVar38));
      if (pcVar10 < dest + ((ulong)uVar26 + lVar14 & 0xffffffff) / 0xff + uVar12 + 9) {
        return 0;
      }
      plVar32 = (long *)(dest + 1);
      if ((uint)((ulong)uVar26 + lVar14) < 0xf) {
        *dest = cVar11;
      }
      else {
        uVar7 = (ulong)(uVar26 - 0xf) + lVar14;
        *dest = -0x10;
        if (0xfe < (int)uVar7) {
          uVar39 = 0x1fd;
          if (uVar23 < 0x1fd) {
            uVar39 = uVar23;
          }
          if (0x1fc < (int)uVar23) {
            uVar23 = 0x1fd;
          }
          memset(plVar32,0xff,(ulong)((((uVar26 + 0xef) - uVar39) + iVar44) / 0xff + 1));
          uVar39 = ((uVar26 + 0xef) - uVar23) + iVar44;
          plVar32 = (long *)(dest + (ulong)uVar39 / 0xff + 2);
          uVar7 = (ulong)((uVar26 - 0x10e) + iVar44 + (uVar39 % 0xff - uVar39));
        }
        *(char *)plVar32 = (char)uVar7;
        plVar32 = (long *)((long)plVar32 + 1);
      }
      plVar25 = (long *)(uVar12 + (long)plVar32);
      do {
        *plVar32 = *plVar38;
        plVar32 = plVar32 + 1;
        plVar38 = plVar38 + 1;
      } while (plVar32 < plVar25);
      do {
        *(short *)plVar25 = (short)plVar17 - (short)piVar24;
        puVar42 = (ulong *)((long)plVar17 + 4);
        puVar30 = (ulong *)(piVar24 + 1);
        puVar43 = puVar42;
        if (puVar42 < puVar41) {
          if (*puVar30 == *puVar42) {
            puVar30 = (ulong *)(piVar24 + 3);
            puVar43 = (ulong *)((long)plVar17 + 0xc);
            goto LAB_001173b2;
          }
          uVar12 = *puVar42 ^ *puVar30;
          lVar37 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar39 = (uint)lVar37 >> 3;
        }
        else {
LAB_001173b2:
          if (puVar43 < puVar41) {
            iVar19 = ((int)puVar43 - (int)plVar17) + -4;
LAB_001173c0:
            if (*puVar30 == *puVar43) goto code_r0x001173cc;
            uVar7 = *puVar43 ^ *puVar30;
            uVar12 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar39 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00117445;
          }
LAB_001173dc:
          if ((puVar43 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar30 == (int)*puVar43))
          {
            puVar43 = (ulong *)((long)puVar43 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar43 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar30 == (short)*puVar43)) {
            puVar43 = (ulong *)((long)puVar43 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar43 < source + ((ulong)(uint)inputSize - 5)) {
            puVar43 = (ulong *)((long)puVar43 + (ulong)((char)*puVar30 == (char)*puVar43));
          }
          uVar39 = (int)puVar43 - (int)puVar42;
        }
LAB_00117445:
        if (pcVar10 < (char *)((long)plVar25 + (ulong)(uVar39 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar8 = (char *)((long)plVar25 + 2);
        if (uVar39 < 0xf) {
          *dest = *dest + (char)uVar39;
          dest = pcVar8;
        }
        else {
          *dest = *dest + '\x0f';
          uVar21 = (ushort)(uVar39 - 0xf);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          if (0x3fb < uVar39 - 0xf) {
            uVar21 = (ushort)((ulong)(uVar39 - 0x40b) % 0x3fc);
            uVar12 = (ulong)((uVar39 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar25 + 6),0xff,uVar12 + 4);
            pcVar8 = (char *)((long)plVar25 + uVar12 + 6);
          }
          pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
          dest = pcVar8 + uVar21 / 0xff + 1;
        }
        lVar37 = (long)plVar17 + (ulong)uVar39;
        plVar38 = (long *)(lVar37 + 4);
        if (plVar6 <= plVar38) break;
        *(int *)((long)LZ4_stream +
                ((ulong)(*(long *)(lVar37 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar37 + 2) - iVar22;
        uVar12 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
        uVar26 = (int)plVar38 - iVar22;
        uVar39 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar26;
        if ((uVar39 + 0xffff < uVar26) ||
           (piVar24 = (int *)((ulong)uVar39 + lVar40), *piVar24 != *(int *)plVar38))
        goto LAB_0011756f;
        plVar25 = (long *)(dest + 1);
        *dest = '\0';
        plVar17 = plVar38;
      } while( true );
    }
LAB_0011759a:
    pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar38);
    if (pcVar10 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) {
      return 0;
    }
    if (pcVar8 < (char *)0xf) {
      *dest = (char)pcVar8 << 4;
      goto LAB_001183a5;
    }
    *dest = -0x10;
    pcVar10 = dest;
  }
  cVar4 = (char)(pcVar8 + -0xf);
  dest = pcVar10 + 1;
  if ((char *)0xfe < pcVar8 + -0xf) {
    uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
    memset(dest,0xff,uVar9 + 1);
    cVar4 = (char)uVar9 + (char)pcVar8 + -0xe;
    dest = pcVar10 + uVar9 + 2;
  }
  *dest = cVar4;
LAB_001183a5:
  memcpy(dest + 1,plVar38,(size_t)pcVar8);
  return ((int)(dest + 1) + (int)pcVar8) - local_c8;
LAB_00116210:
  lVar14 = lVar14 + (ulong)uVar2;
  piVar24 = (int *)source;
  if (uVar2 < uVar26) {
    piVar24 = piVar34;
  }
  iVar19 = uVar23 - uVar2;
  uVar18 = (int)puVar31 - (int)puVar41;
  lVar29 = 0;
  uVar23 = uVar18 - 0xf;
  cVar4 = (char)puVar31 * '\x10' + (char)puVar41 * -0x10;
  do {
    cVar11 = cVar4;
    uVar35 = uVar23;
    lVar28 = lVar29;
    piVar20 = (int *)(lVar14 + lVar28);
    puVar43 = (ulong *)((long)puVar31 + lVar28);
    if ((piVar20 <= piVar24) || (puVar43 <= puVar41)) break;
    lVar29 = lVar28 + -1;
    uVar23 = uVar35 - 1;
    cVar4 = cVar11 + -0x10;
  } while (*(char *)((long)puVar31 + lVar28 + -1) == *(char *)(lVar14 + -1 + lVar28));
  iVar22 = (int)lVar28;
  uVar9 = (ulong)(uint)(((int)puVar31 - (int)puVar41) + iVar22);
  uVar23 = 0;
  if (local_100 + ((ulong)uVar18 + lVar28 & 0xffffffff) / 0xff + uVar9 + 9 <= pcVar10) {
    puVar31 = (ulong *)(local_100 + 1);
    if ((uint)((ulong)uVar18 + lVar28) < 0xf) {
      *local_100 = cVar11;
    }
    else {
      uVar12 = (ulong)(uVar18 - 0xf) + lVar28;
      *local_100 = -0x10;
      if (0xfe < (int)uVar12) {
        uVar23 = 0x1fd;
        if (uVar35 < 0x1fd) {
          uVar23 = uVar35;
        }
        if (0x1fc < (int)uVar35) {
          uVar35 = 0x1fd;
        }
        memset(puVar31,0xff,(ulong)((((uVar18 + 0xef) - uVar23) + iVar22) / 0xff + 1));
        uVar23 = ((uVar18 + 0xef) - uVar35) + iVar22;
        puVar31 = (ulong *)(local_100 + (ulong)uVar23 / 0xff + 2);
        uVar12 = (ulong)((uVar18 - 0x10e) + iVar22 + (uVar23 % 0xff - uVar23));
      }
      *(char *)puVar31 = (char)uVar12;
      puVar31 = (ulong *)((long)puVar31 + 1);
    }
    puVar13 = (ulong *)(uVar9 + (long)puVar31);
    do {
      *puVar31 = *puVar41;
      puVar31 = puVar31 + 1;
      puVar41 = puVar41 + 1;
    } while (puVar31 < puVar13);
    do {
      *(short *)puVar13 = (short)iVar19;
      if (piVar24 == piVar34) {
        puVar31 = (ulong *)((lVar37 - (long)piVar20) + (long)puVar43);
        if (puVar30 < puVar31) {
          puVar31 = puVar30;
        }
        puVar41 = (ulong *)((long)puVar43 + 4);
        puVar27 = (ulong *)(piVar20 + 1);
        puVar15 = (ulong *)((long)puVar31 - 7);
        puVar16 = puVar41;
        if (puVar41 < puVar15) {
          if (*puVar27 == *puVar41) {
            puVar27 = (ulong *)(piVar20 + 3);
            puVar16 = (ulong *)((long)puVar43 + 0xc);
            goto LAB_001164b6;
          }
          uVar9 = *puVar41 ^ *puVar27;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar18 = (uint)lVar14 >> 3;
        }
        else {
LAB_001164b6:
          if (puVar16 < puVar15) {
            iVar19 = ((int)puVar16 - (int)puVar43) + -4;
LAB_001164c8:
            if (*puVar27 == *puVar16) goto code_r0x001164d7;
            uVar12 = *puVar16 ^ *puVar27;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar18 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00116584;
          }
LAB_001164e8:
          if ((puVar16 < (ulong *)((long)puVar31 - 3U)) && ((int)*puVar27 == (int)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar16 < (ulong *)((long)puVar31 - 1U)) && ((short)*puVar27 == (short)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar16 < puVar31) {
            puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar27 == (char)*puVar16));
          }
          uVar18 = (int)puVar16 - (int)puVar41;
        }
LAB_00116584:
        puVar41 = (ulong *)((long)puVar43 + (ulong)uVar18 + 4);
        if (puVar41 == puVar31) {
          puVar15 = puVar31;
          puVar27 = (ulong *)source;
          if (puVar31 < puVar1) {
            if (*(ulong *)source == *puVar31) {
              puVar15 = puVar31 + 1;
              puVar27 = (ulong *)(source + 8);
              goto LAB_001165bc;
            }
            uVar12 = *puVar31 ^ *(ulong *)source;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = uVar9 >> 3 & 0x1fffffff;
          }
          else {
LAB_001165bc:
            if (puVar15 < puVar1) {
              puVar43 = (ulong *)((long)puVar43 + (lVar37 - (long)piVar20));
              if (puVar30 <= puVar43) {
                puVar43 = puVar30;
              }
              iVar19 = (int)puVar15 - (int)puVar43;
LAB_001165de:
              if (*puVar27 == *puVar15) goto code_r0x001165e9;
              uVar12 = *puVar15 ^ *puVar27;
              uVar9 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19);
              goto LAB_00116666;
            }
LAB_001165fa:
            if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar27 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar27 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar15 < puVar30) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar27 == (char)*puVar15));
            }
            uVar9 = (ulong)(uint)((int)puVar15 - (int)puVar31);
          }
LAB_00116666:
          uVar18 = uVar18 + (int)uVar9;
          puVar41 = (ulong *)((long)puVar41 + uVar9);
        }
      }
      else {
        puVar41 = (ulong *)((long)puVar43 + 4);
        puVar31 = (ulong *)(piVar20 + 1);
        puVar15 = puVar41;
        if (puVar41 < puVar1) {
          if (*puVar31 == *puVar41) {
            puVar31 = (ulong *)(piVar20 + 3);
            puVar15 = (ulong *)((long)puVar43 + 0xc);
            goto LAB_001163fa;
          }
          uVar9 = *puVar41 ^ *puVar31;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar18 = (uint)lVar14 >> 3;
        }
        else {
LAB_001163fa:
          if (puVar15 < puVar1) {
            iVar19 = ((int)puVar15 - (int)puVar43) + -4;
LAB_00116407:
            if (*puVar31 == *puVar15) goto code_r0x00116416;
            uVar12 = *puVar15 ^ *puVar31;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar18 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00116555;
          }
LAB_00116426:
          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar31 == (int)*puVar15))
          {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar31 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar15 < puVar30) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar31 == (char)*puVar15));
          }
          uVar18 = (int)puVar15 - (int)puVar41;
        }
LAB_00116555:
        puVar41 = (ulong *)((long)puVar43 + (ulong)uVar18 + 4);
      }
      uVar23 = 0;
      if (pcVar10 < (char *)((long)puVar13 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) break;
      pcVar8 = (char *)((long)puVar13 + 2);
      if (uVar18 < 0xf) {
        *local_100 = *local_100 + (char)uVar18;
        local_100 = pcVar8;
      }
      else {
        *local_100 = *local_100 + '\x0f';
        uVar21 = (ushort)(uVar18 - 0xf);
        pcVar8[0] = -1;
        pcVar8[1] = -1;
        pcVar8[2] = -1;
        pcVar8[3] = -1;
        if (0x3fb < uVar18 - 0xf) {
          uVar21 = (ushort)((ulong)(uVar18 - 0x40b) % 0x3fc);
          uVar9 = (ulong)((uVar18 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar13 + 6),0xff,uVar9 + 4);
          pcVar8 = (char *)((long)puVar13 + uVar9 + 6);
        }
        pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
        local_100 = pcVar8 + uVar21 / 0xff + 1;
      }
      if (puVar42 <= puVar41) goto LAB_001183c9;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar41 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar41 + -2) - local_d8;
      uVar9 = *puVar41 * -0x30e4432345000000 >> 0x34;
      uVar18 = (int)puVar41 - local_d8;
      uVar23 = *(uint *)((long)LZ4_stream + uVar9 * 4);
      piVar24 = (int *)source;
      lVar14 = lVar5;
      if (uVar23 < uVar26) {
        piVar24 = piVar34;
        lVar14 = lVar40;
      }
      *(uint *)((long)LZ4_stream + uVar9 * 4) = uVar18;
      if (((uVar23 < uVar26 - uVar39) || (uVar23 + 0xffff < uVar18)) ||
         (piVar20 = (int *)(lVar14 + (ulong)uVar23), *piVar20 != (int)*puVar41)) goto LAB_001167e0;
      puVar13 = (ulong *)(local_100 + 1);
      *local_100 = '\0';
      iVar19 = uVar18 - uVar23;
      puVar43 = puVar41;
    } while( true );
  }
  goto LAB_00118565;
code_r0x001164d7:
  puVar16 = puVar16 + 1;
  puVar27 = puVar27 + 1;
  iVar19 = iVar19 + 8;
  if (puVar15 <= puVar16) goto LAB_001164e8;
  goto LAB_001164c8;
code_r0x001165e9:
  puVar15 = puVar15 + 1;
  puVar27 = puVar27 + 1;
  iVar19 = iVar19 + 8;
  if (puVar1 <= puVar15) goto LAB_001165fa;
  goto LAB_001165de;
code_r0x00116416:
  puVar15 = puVar15 + 1;
  puVar31 = puVar31 + 1;
  iVar19 = iVar19 + 8;
  if (puVar1 <= puVar15) goto LAB_00116426;
  goto LAB_00116407;
LAB_001167e0:
  puVar31 = (ulong *)((long)puVar41 + 1);
  uVar23 = (int)puVar31 - local_d8;
  puVar43 = (ulong *)((long)puVar41 + 2);
  if (puVar42 < puVar43) goto LAB_001183c9;
  goto LAB_00116199;
LAB_00116aee:
  lVar14 = lVar14 + (ulong)uVar35;
  piVar24 = (int *)source;
  if (uVar35 < uVar26) {
    piVar24 = piVar34;
  }
  iVar19 = uVar39 - uVar35;
  uVar18 = (int)puVar31 - (int)puVar41;
  lVar29 = 0;
  uVar39 = uVar18 - 0xf;
  cVar4 = (char)puVar31 * '\x10' + (char)puVar41 * -0x10;
  do {
    cVar11 = cVar4;
    uVar35 = uVar39;
    lVar28 = lVar29;
    piVar20 = (int *)(lVar14 + lVar28);
    puVar43 = (ulong *)((long)puVar31 + lVar28);
    if ((piVar20 <= piVar24) || (puVar43 <= puVar41)) break;
    lVar29 = lVar28 + -1;
    uVar39 = uVar35 - 1;
    cVar4 = cVar11 + -0x10;
  } while (*(char *)((long)puVar31 + lVar28 + -1) == *(char *)(lVar14 + -1 + lVar28));
  iVar22 = (int)lVar28;
  uVar9 = (ulong)(uint)(((int)puVar31 - (int)puVar41) + iVar22);
  uVar23 = 0;
  if (local_f8 + ((ulong)uVar18 + lVar28 & 0xffffffff) / 0xff + uVar9 + 9 <= pcVar10) {
    puVar31 = (ulong *)(local_f8 + 1);
    if ((uint)((ulong)uVar18 + lVar28) < 0xf) {
      *local_f8 = cVar11;
    }
    else {
      uVar12 = (ulong)(uVar18 - 0xf) + lVar28;
      *local_f8 = -0x10;
      if (0xfe < (int)uVar12) {
        uVar39 = 0x1fd;
        if (uVar35 < 0x1fd) {
          uVar39 = uVar35;
        }
        if (0x1fc < (int)uVar35) {
          uVar35 = 0x1fd;
        }
        memset(puVar31,0xff,(ulong)((((uVar18 + 0xef) - uVar39) + iVar22) / 0xff + 1));
        uVar39 = ((uVar18 + 0xef) - uVar35) + iVar22;
        puVar31 = (ulong *)(local_f8 + (ulong)uVar39 / 0xff + 2);
        uVar12 = (ulong)((uVar18 - 0x10e) + iVar22 + (uVar39 % 0xff - uVar39));
      }
      *(char *)puVar31 = (char)uVar12;
      puVar31 = (ulong *)((long)puVar31 + 1);
    }
    puVar13 = (ulong *)(uVar9 + (long)puVar31);
    do {
      *puVar31 = *puVar41;
      puVar31 = puVar31 + 1;
      puVar41 = puVar41 + 1;
    } while (puVar31 < puVar13);
    do {
      *(short *)puVar13 = (short)iVar19;
      if (piVar24 == piVar34) {
        puVar31 = (ulong *)((lVar37 - (long)piVar20) + (long)puVar43);
        if (puVar30 < puVar31) {
          puVar31 = puVar30;
        }
        puVar41 = (ulong *)((long)puVar43 + 4);
        puVar27 = (ulong *)(piVar20 + 1);
        puVar15 = (ulong *)((long)puVar31 - 7);
        puVar16 = puVar41;
        if (puVar41 < puVar15) {
          if (*puVar27 == *puVar41) {
            puVar27 = (ulong *)(piVar20 + 3);
            puVar16 = (ulong *)((long)puVar43 + 0xc);
            goto LAB_00116d9b;
          }
          uVar9 = *puVar41 ^ *puVar27;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar39 = (uint)lVar14 >> 3;
        }
        else {
LAB_00116d9b:
          if (puVar16 < puVar15) {
            iVar19 = ((int)puVar16 - (int)puVar43) + -4;
LAB_00116dad:
            if (*puVar27 == *puVar16) goto code_r0x00116dbc;
            uVar12 = *puVar16 ^ *puVar27;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar39 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00116e5d;
          }
LAB_00116dcd:
          if ((puVar16 < (ulong *)((long)puVar31 - 3U)) && ((int)*puVar27 == (int)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar16 < (ulong *)((long)puVar31 - 1U)) && ((short)*puVar27 == (short)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar16 < puVar31) {
            puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar27 == (char)*puVar16));
          }
          uVar39 = (int)puVar16 - (int)puVar41;
        }
LAB_00116e5d:
        puVar41 = (ulong *)((long)puVar43 + (ulong)uVar39 + 4);
        if (puVar41 == puVar31) {
          puVar15 = puVar31;
          puVar27 = (ulong *)source;
          if (puVar31 < puVar1) {
            if (*(ulong *)source == *puVar31) {
              puVar15 = puVar31 + 1;
              puVar27 = (ulong *)(source + 8);
              goto LAB_00116e95;
            }
            uVar12 = *puVar31 ^ *(ulong *)source;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = uVar9 >> 3 & 0x1fffffff;
          }
          else {
LAB_00116e95:
            if (puVar15 < puVar1) {
              puVar43 = (ulong *)((long)puVar43 + (lVar37 - (long)piVar20));
              if (puVar30 <= puVar43) {
                puVar43 = puVar30;
              }
              iVar19 = (int)puVar15 - (int)puVar43;
LAB_00116eb7:
              if (*puVar27 == *puVar15) goto code_r0x00116ec2;
              uVar12 = *puVar15 ^ *puVar27;
              uVar9 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19);
              goto LAB_00116f3f;
            }
LAB_00116ed3:
            if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar27 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar27 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar15 < puVar30) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar27 == (char)*puVar15));
            }
            uVar9 = (ulong)(uint)((int)puVar15 - (int)puVar31);
          }
LAB_00116f3f:
          uVar39 = uVar39 + (int)uVar9;
          puVar41 = (ulong *)((long)puVar41 + uVar9);
        }
      }
      else {
        puVar41 = (ulong *)((long)puVar43 + 4);
        puVar31 = (ulong *)(piVar20 + 1);
        puVar15 = puVar41;
        if (puVar41 < puVar1) {
          if (*puVar31 == *puVar41) {
            puVar31 = (ulong *)(piVar20 + 3);
            puVar15 = (ulong *)((long)puVar43 + 0xc);
            goto LAB_00116cdf;
          }
          uVar9 = *puVar41 ^ *puVar31;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar39 = (uint)lVar14 >> 3;
        }
        else {
LAB_00116cdf:
          if (puVar15 < puVar1) {
            iVar19 = ((int)puVar15 - (int)puVar43) + -4;
LAB_00116cec:
            if (*puVar31 == *puVar15) goto code_r0x00116cfb;
            uVar12 = *puVar15 ^ *puVar31;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar39 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar19;
            goto LAB_00116e2e;
          }
LAB_00116d0b:
          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar31 == (int)*puVar15))
          {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar31 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar15 < puVar30) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar31 == (char)*puVar15));
          }
          uVar39 = (int)puVar15 - (int)puVar41;
        }
LAB_00116e2e:
        puVar41 = (ulong *)((long)puVar43 + (ulong)uVar39 + 4);
      }
      uVar23 = 0;
      if (pcVar10 < (char *)((long)puVar13 + (ulong)(uVar39 + 0xf0) / 0xff + 8)) break;
      pcVar8 = (char *)((long)puVar13 + 2);
      if (uVar39 < 0xf) {
        *local_f8 = *local_f8 + (char)uVar39;
        local_f8 = pcVar8;
      }
      else {
        *local_f8 = *local_f8 + '\x0f';
        uVar21 = (ushort)(uVar39 - 0xf);
        pcVar8[0] = -1;
        pcVar8[1] = -1;
        pcVar8[2] = -1;
        pcVar8[3] = -1;
        if (0x3fb < uVar39 - 0xf) {
          uVar21 = (ushort)((ulong)(uVar39 - 0x40b) % 0x3fc);
          uVar9 = (ulong)((uVar39 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar13 + 6),0xff,uVar9 + 4);
          pcVar8 = (char *)((long)puVar13 + uVar9 + 6);
        }
        pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
        local_f8 = pcVar8 + uVar21 / 0xff + 1;
      }
      if (puVar42 <= puVar41) goto LAB_00117dc4;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar41 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar41 + -2) - local_d8;
      uVar9 = *puVar41 * -0x30e4432345000000 >> 0x34;
      uVar23 = (int)puVar41 - local_d8;
      uVar39 = *(uint *)((long)LZ4_stream + uVar9 * 4);
      piVar24 = (int *)source;
      lVar14 = lVar5;
      if (uVar39 < uVar26) {
        piVar24 = piVar34;
        lVar14 = lVar40;
      }
      *(uint *)((long)LZ4_stream + uVar9 * 4) = uVar23;
      if ((uVar39 + 0xffff < uVar23) ||
         (piVar20 = (int *)(lVar14 + (ulong)uVar39), *piVar20 != (int)*puVar41)) goto LAB_001170cf;
      puVar13 = (ulong *)(local_f8 + 1);
      *local_f8 = '\0';
      iVar19 = uVar23 - uVar39;
      puVar43 = puVar41;
    } while( true );
  }
  goto LAB_00118565;
code_r0x00116dbc:
  puVar16 = puVar16 + 1;
  puVar27 = puVar27 + 1;
  iVar19 = iVar19 + 8;
  if (puVar15 <= puVar16) goto LAB_00116dcd;
  goto LAB_00116dad;
code_r0x00116ec2:
  puVar15 = puVar15 + 1;
  puVar27 = puVar27 + 1;
  iVar19 = iVar19 + 8;
  if (puVar1 <= puVar15) goto LAB_00116ed3;
  goto LAB_00116eb7;
code_r0x00116cfb:
  puVar15 = puVar15 + 1;
  puVar31 = puVar31 + 1;
  iVar19 = iVar19 + 8;
  if (puVar1 <= puVar15) goto LAB_00116d0b;
  goto LAB_00116cec;
LAB_001170cf:
  puVar31 = (ulong *)((long)puVar41 + 1);
  uVar39 = (int)puVar31 - local_d8;
  puVar43 = (ulong *)((long)puVar41 + 2);
  if (puVar42 < puVar43) goto LAB_00117dc4;
  goto LAB_00116a81;
code_r0x00117a1d:
  puVar16 = puVar16 + 1;
  puVar27 = puVar27 + 1;
  iVar44 = iVar44 + 8;
  if (puVar15 <= puVar16) goto LAB_00117a2e;
  goto LAB_00117a12;
code_r0x00117b09:
  puVar15 = puVar15 + 1;
  puVar27 = puVar27 + 1;
  iVar44 = iVar44 + 8;
  if (puVar1 <= puVar15) goto LAB_00117b1a;
  goto LAB_00117afe;
code_r0x0011795a:
  puVar15 = puVar15 + 1;
  puVar31 = puVar31 + 1;
  iVar44 = iVar44 + 8;
  if (puVar1 <= puVar15) goto LAB_0011796a;
  goto LAB_0011794b;
LAB_00117d94:
  puVar31 = (ulong *)((long)puVar41 + 1);
  uVar26 = (int)puVar31 - iVar22;
  puVar43 = (ulong *)((long)puVar41 + 2);
  if (puVar42 < puVar43) goto LAB_001168c1;
  goto LAB_001176ab;
LAB_00115973:
  lVar14 = lVar14 + (ulong)uVar35;
  piVar34 = (int *)source;
  if (uVar35 < uVar39) {
    piVar34 = piVar24;
  }
  iVar22 = uVar26 - uVar35;
  uVar18 = (int)puVar30 - (int)puVar41;
  lVar29 = 0;
  uVar26 = uVar18 - 0xf;
  cVar4 = (char)puVar30 * '\x10' + (char)puVar41 * -0x10;
  do {
    cVar11 = cVar4;
    uVar35 = uVar26;
    lVar28 = lVar29;
    piVar20 = (int *)(lVar14 + lVar28);
    puVar42 = (ulong *)((long)puVar30 + lVar28);
    if ((piVar20 <= piVar34) || (puVar42 <= puVar41)) break;
    lVar29 = lVar28 + -1;
    uVar26 = uVar35 - 1;
    cVar4 = cVar11 + -0x10;
  } while (*(char *)((long)puVar30 + lVar28 + -1) == *(char *)(lVar14 + -1 + lVar28));
  iVar44 = (int)lVar28;
  uVar9 = (ulong)(uint)(((int)puVar30 - (int)puVar41) + iVar44);
  uVar23 = 0;
  if (dest + ((ulong)uVar18 + lVar28 & 0xffffffff) / 0xff + uVar9 + 9 <= pcVar10) {
    puVar30 = (ulong *)(dest + 1);
    if ((uint)((ulong)uVar18 + lVar28) < 0xf) {
      *dest = cVar11;
    }
    else {
      uVar12 = (ulong)(uVar18 - 0xf) + lVar28;
      *dest = -0x10;
      if (0xfe < (int)uVar12) {
        uVar26 = 0x1fd;
        if (uVar35 < 0x1fd) {
          uVar26 = uVar35;
        }
        if (0x1fc < (int)uVar35) {
          uVar35 = 0x1fd;
        }
        memset(puVar30,0xff,(ulong)((((uVar18 + 0xef) - uVar26) + iVar44) / 0xff + 1));
        uVar26 = ((uVar18 + 0xef) - uVar35) + iVar44;
        puVar30 = (ulong *)(dest + (ulong)uVar26 / 0xff + 2);
        uVar12 = (ulong)((uVar18 - 0x10e) + iVar44 + (uVar26 % 0xff - uVar26));
      }
      *(char *)puVar30 = (char)uVar12;
      puVar30 = (ulong *)((long)puVar30 + 1);
    }
    puVar13 = (ulong *)(uVar9 + (long)puVar30);
    do {
      *puVar30 = *puVar41;
      puVar30 = puVar30 + 1;
      puVar41 = puVar41 + 1;
    } while (puVar30 < puVar13);
    do {
      *(short *)puVar13 = (short)iVar22;
      if (piVar34 == piVar24) {
        puVar30 = (ulong *)((lVar37 - (long)piVar20) + (long)puVar42);
        if (puVar31 < puVar30) {
          puVar30 = puVar31;
        }
        puVar41 = (ulong *)((long)puVar42 + 4);
        puVar27 = (ulong *)(piVar20 + 1);
        puVar15 = (ulong *)((long)puVar30 - 7);
        puVar16 = puVar41;
        if (puVar41 < puVar15) {
          if (*puVar27 == *puVar41) {
            puVar27 = (ulong *)(piVar20 + 3);
            puVar16 = (ulong *)((long)puVar42 + 0xc);
            goto LAB_00115c1b;
          }
          uVar9 = *puVar41 ^ *puVar27;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar26 = (uint)lVar14 >> 3;
        }
        else {
LAB_00115c1b:
          if (puVar16 < puVar15) {
            iVar22 = ((int)puVar16 - (int)puVar42) + -4;
LAB_00115c2a:
            if (*puVar27 == *puVar16) goto code_r0x00115c39;
            uVar12 = *puVar16 ^ *puVar27;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar26 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar22;
            goto LAB_00115ce0;
          }
LAB_00115c4a:
          if ((puVar16 < (ulong *)((long)puVar30 - 3U)) && ((int)*puVar27 == (int)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar16 < (ulong *)((long)puVar30 - 1U)) && ((short)*puVar27 == (short)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar16 < puVar30) {
            puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar27 == (char)*puVar16));
          }
          uVar26 = (int)puVar16 - (int)puVar41;
        }
LAB_00115ce0:
        puVar41 = (ulong *)((long)puVar42 + (ulong)uVar26 + 4);
        if (puVar41 == puVar30) {
          puVar15 = puVar30;
          puVar27 = (ulong *)source;
          if (puVar30 < puVar1) {
            if (*(ulong *)source == *puVar30) {
              puVar15 = puVar30 + 1;
              puVar27 = (ulong *)(source + 8);
              goto LAB_00115d18;
            }
            uVar12 = *puVar30 ^ *(ulong *)source;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = uVar9 >> 3 & 0x1fffffff;
          }
          else {
LAB_00115d18:
            if (puVar15 < puVar1) {
              puVar42 = (ulong *)((long)puVar42 + (lVar37 - (long)piVar20));
              if (puVar31 <= puVar42) {
                puVar42 = puVar31;
              }
              iVar22 = (int)puVar15 - (int)puVar42;
LAB_00115d37:
              if (*puVar27 == *puVar15) goto code_r0x00115d42;
              uVar12 = *puVar15 ^ *puVar27;
              uVar9 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar22);
              goto LAB_00115db9;
            }
LAB_00115d53:
            if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar27 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar27 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar15 < puVar31) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar27 == (char)*puVar15));
            }
            uVar9 = (ulong)(uint)((int)puVar15 - (int)puVar30);
          }
LAB_00115db9:
          uVar26 = uVar26 + (int)uVar9;
          puVar41 = (ulong *)((long)puVar41 + uVar9);
        }
      }
      else {
        puVar41 = (ulong *)((long)puVar42 + 4);
        puVar30 = (ulong *)(piVar20 + 1);
        puVar15 = puVar41;
        if (puVar41 < puVar1) {
          if (*puVar30 == *puVar41) {
            puVar30 = (ulong *)(piVar20 + 3);
            puVar15 = (ulong *)((long)puVar42 + 0xc);
            goto LAB_00115b58;
          }
          uVar9 = *puVar41 ^ *puVar30;
          lVar14 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar26 = (uint)lVar14 >> 3;
        }
        else {
LAB_00115b58:
          if (puVar15 < puVar1) {
            iVar22 = ((int)puVar15 - (int)puVar42) + -4;
LAB_00115b65:
            if (*puVar30 == *puVar15) goto code_r0x00115b74;
            uVar12 = *puVar15 ^ *puVar30;
            uVar9 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar26 = ((uint)(uVar9 >> 3) & 0x1fffffff) + iVar22;
            goto LAB_00115cb4;
          }
LAB_00115b84:
          if ((puVar15 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar30 == (int)*puVar15))
          {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar15 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar30 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar15 < puVar31) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar30 == (char)*puVar15));
          }
          uVar26 = (int)puVar15 - (int)puVar41;
        }
LAB_00115cb4:
        puVar41 = (ulong *)((long)puVar42 + (ulong)uVar26 + 4);
      }
      uVar23 = 0;
      if (pcVar10 < (char *)((long)puVar13 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) break;
      pcVar8 = (char *)((long)puVar13 + 2);
      if (uVar26 < 0xf) {
        *dest = *dest + (char)uVar26;
        dest = pcVar8;
      }
      else {
        *dest = *dest + '\x0f';
        uVar21 = (ushort)(uVar26 - 0xf);
        pcVar8[0] = -1;
        pcVar8[1] = -1;
        pcVar8[2] = -1;
        pcVar8[3] = -1;
        if (0x3fb < uVar26 - 0xf) {
          uVar21 = (ushort)((ulong)(uVar26 - 0x40b) % 0x3fc);
          uVar9 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar13 + 6),0xff,uVar9 + 4);
          pcVar8 = (char *)((long)puVar13 + uVar9 + 6);
        }
        pcVar8[uVar21 / 0xff] = (char)(uVar21 % 0xff);
        dest = pcVar8 + uVar21 / 0xff + 1;
      }
      if (puVar43 <= puVar41) goto LAB_0011846d;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar41 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar41 + -2) - iVar19;
      uVar9 = *puVar41 * -0x30e4432345000000 >> 0x34;
      uVar23 = (int)puVar41 - iVar19;
      uVar26 = *(uint *)((long)LZ4_stream + uVar9 * 4);
      piVar34 = (int *)source;
      lVar14 = lVar5;
      if (uVar26 < uVar39) {
        piVar34 = piVar24;
        lVar14 = lVar40;
      }
      *(uint *)((long)LZ4_stream + uVar9 * 4) = uVar23;
      if ((uVar26 + 0xffff < uVar23) ||
         (piVar20 = (int *)(lVar14 + (ulong)uVar26), *piVar20 != (int)*puVar41)) goto LAB_00115f3d;
      puVar13 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar22 = uVar23 - uVar26;
      puVar42 = puVar41;
    } while( true );
  }
  goto LAB_00118565;
code_r0x00115c39:
  puVar16 = puVar16 + 1;
  puVar27 = puVar27 + 1;
  iVar22 = iVar22 + 8;
  if (puVar15 <= puVar16) goto LAB_00115c4a;
  goto LAB_00115c2a;
code_r0x00115d42:
  puVar15 = puVar15 + 1;
  puVar27 = puVar27 + 1;
  iVar22 = iVar22 + 8;
  if (puVar1 <= puVar15) goto LAB_00115d53;
  goto LAB_00115d37;
code_r0x00115b74:
  puVar15 = puVar15 + 1;
  puVar30 = puVar30 + 1;
  iVar22 = iVar22 + 8;
  if (puVar1 <= puVar15) goto LAB_00115b84;
  goto LAB_00115b65;
LAB_00115f3d:
  puVar30 = (ulong *)((long)puVar41 + 1);
  uVar26 = (int)puVar30 - iVar19;
  puVar42 = (ulong *)((long)puVar41 + 2);
  if (puVar43 < puVar42) goto LAB_0011846d;
  goto LAB_00115909;
LAB_0011846d:
  pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar41);
  uVar23 = 0;
  if (pcVar10 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) goto LAB_00118565;
  if (pcVar8 < (char *)0xf) {
    *dest = (char)pcVar8 << 4;
  }
  else {
    pcVar10 = pcVar8 + -0xf;
    *dest = -0x10;
    pcVar33 = dest + 1;
    if ((char *)0xfe < pcVar10) {
      uVar9 = (ulong)(pcVar8 + -0x10e) / 0xff;
      memset(pcVar33,0xff,uVar9 + 1);
      pcVar10 = pcVar8 + uVar9 * -0xff + -0x10e;
      pcVar33 = dest + uVar9 + 2;
    }
    *pcVar33 = (char)pcVar10;
    dest = pcVar33;
  }
LAB_00118518:
  memcpy(dest + 1,puVar41,(size_t)pcVar8);
  uVar23 = ((int)(dest + 1) + (int)pcVar8) - local_c8;
  goto LAB_00118565;
code_r0x001173cc:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  iVar19 = iVar19 + 8;
  if (puVar41 <= puVar43) goto LAB_001173dc;
  goto LAB_001173c0;
LAB_0011756f:
  plVar17 = (long *)(lVar37 + 6);
  if (plVar6 < plVar17) goto LAB_0011759a;
  goto LAB_001171bd;
code_r0x00118122:
  puVar43 = puVar43 + 1;
  puVar30 = puVar30 + 1;
  iVar19 = iVar19 + 8;
  if (puVar41 <= puVar43) goto LAB_00118132;
  goto LAB_00118117;
LAB_001182c0:
  plVar17 = (long *)(lVar37 + 6);
  if (plVar6 < plVar17) goto LAB_0011830e;
  goto LAB_00117f0c;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* const streamPtr = &LZ4_stream->internal_donotuse;
    const char* dictEnd = streamPtr->dictSize ? (const char*)streamPtr->dictionary + streamPtr->dictSize : NULL;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i, dictSize=%u)", inputSize, streamPtr->dictSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* fix index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize < 4)     /* tiny dictionary : not enough for a hash */
      && (dictEnd != source)           /* prefix mode */
      && (inputSize > 0)               /* tolerance : don't lose history, in case next invocation would use prefix mode */
      && (streamPtr->dictCtx == NULL)  /* usingDictCtx */
      ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        /* remove dictionary existence from history, to employ faster prefix mode */
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = source;
    }

    /* Check overlapping input/dictionary space */
    {   const char* const sourceEnd = source + inputSize;
        if ((sourceEnd > (const char*)streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = (const BYTE*)dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {  /* small data <= 4 KB */
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}